

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::RequestBuilder::Execute(RequestBuilder *this)

{
  Worker *this_00;
  _Head_base<0UL,_restincurl::Request_*,_false> local_10;
  
  Build(this);
  local_10._M_head_impl =
       (this->request_)._M_t.
       super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
       super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
       super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
  this_00 = this->worker_;
  (this->request_)._M_t.
  super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
  super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
  super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl = (Request *)0x0;
  Worker::Enqueue(this_00,(ptr_t *)&local_10);
  std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::~unique_ptr
            ((unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *)&local_10
            );
  return;
}

Assistant:

void Execute() {
            Build();
            worker_.Enqueue(std::move(request_));
        }